

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRegistry.cpp
# Opt level: O2

void __thiscall TestRegistry::runAllTests(TestRegistry *this,TestResult *result)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  TestResult *this_00;
  UtestShell *test;
  
  (*result->_vptr_TestResult[2])(result);
  bVar1 = true;
  test = this->tests_;
  while (test != (UtestShell *)0x0) {
    if (this->runInSeperateProcess_ == true) {
      (*test->_vptr_UtestShell[0x20])(test);
    }
    if (this->runIgnored_ == true) {
      (*test->_vptr_UtestShell[0x21])(test);
    }
    if (bVar1 != false) {
      (*result->_vptr_TestResult[4])(result,test);
    }
    (*result->_vptr_TestResult[8])(result);
    this_00 = (TestResult *)this;
    bVar1 = testShouldRun(this,test,result);
    if (bVar1) {
      (*result->_vptr_TestResult[6])(result,test);
      (*test->_vptr_UtestShell[0x24])(test,this->firstPlugin_,result);
      this_00 = result;
      (*result->_vptr_TestResult[7])(result,test);
    }
    bVar1 = endOfGroup((TestRegistry *)this_00,test);
    if (bVar1) {
      (*result->_vptr_TestResult[5])(result,test);
    }
    iVar2 = (*test->_vptr_UtestShell[3])(test);
    test = (UtestShell *)CONCAT44(extraout_var,iVar2);
  }
  (*result->_vptr_TestResult[3])(result);
  this->currentRepetition_ = this->currentRepetition_ + 1;
  return;
}

Assistant:

void TestRegistry::runAllTests(TestResult& result)
{
    bool groupStart = true;

    result.testsStarted();
    for (UtestShell *test = tests_; test != NULLPTR; test = test->getNext()) {
        if (runInSeperateProcess_) test->setRunInSeperateProcess();
        if (runIgnored_) test->setRunIgnored();

        if (groupStart) {
            result.currentGroupStarted(test);
            groupStart = false;
        }

        result.countTest();
        if (testShouldRun(test, result)) {
            result.currentTestStarted(test);
            test->runOneTest(firstPlugin_, result);
            result.currentTestEnded(test);
        }

        if (endOfGroup(test)) {
            groupStart = true;
            result.currentGroupEnded(test);
        }
    }
    result.testsEnded();
    currentRepetition_++;
}